

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_C14NDocSaveTo(PyObject *self,PyObject *args)

{
  long lVar1;
  int iVar2;
  int iVar3;
  FILE *f;
  undefined8 uVar4;
  PyObject *pPVar5;
  xmlChar **idx;
  xmlChar **ppxVar6;
  char *pcVar7;
  xmlChar **ppxVar8;
  int exclusive;
  int with_comments;
  xmlChar **prefixes;
  xmlNodeSetPtr nodes;
  PyObject *pyobj_prefixes;
  PyObject *pyobj_nodes;
  PyObject *py_file;
  PyObject *pyobj_doc;
  
  prefixes = (xmlChar **)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT
                    (args,"OOiOiO:C14NDocSaveTo",&pyobj_doc,&pyobj_nodes,&exclusive,&pyobj_prefixes,
                     &with_comments,&py_file);
  if (iVar2 == 0) {
    return (PyObject *)0x0;
  }
  if ((pyobj_doc == (PyObject *)&_Py_NoneStruct) || (lVar1 = pyobj_doc[1].ob_refcnt, lVar1 == 0)) {
    pcVar7 = "bad document.";
    uVar4 = _PyExc_TypeError;
  }
  else if ((py_file == (PyObject *)&_Py_NoneStruct) ||
          (f = libxml_PyFileGet(py_file), f == (FILE *)0x0)) {
    pcVar7 = "bad file.";
    uVar4 = _PyExc_TypeError;
  }
  else {
    uVar4 = xmlOutputBufferCreateFile(f,0);
    iVar2 = PyxmlNodeSet_Convert(pyobj_nodes,&nodes);
    if (iVar2 < 0) {
LAB_0013e5a8:
      xmlOutputBufferClose(uVar4);
      return (PyObject *)0x0;
    }
    if (exclusive == 0) {
      ppxVar8 = (xmlChar **)0x0;
      exclusive = 0;
    }
    else {
      iVar2 = PystringSet_Convert(pyobj_prefixes,&prefixes);
      ppxVar8 = prefixes;
      if (iVar2 < 0) {
        if (nodes != (xmlNodeSetPtr)0x0) {
          (*_xmlFree)(nodes->nodeTab);
          (*_xmlFree)(nodes);
        }
        goto LAB_0013e5a8;
      }
    }
    iVar2 = xmlC14NDocSaveTo(lVar1,nodes,exclusive,ppxVar8,with_comments,uVar4);
    if (nodes != (xmlNodeSetPtr)0x0) {
      (*_xmlFree)(nodes->nodeTab);
      (*_xmlFree)(nodes);
    }
    ppxVar6 = ppxVar8;
    if (ppxVar8 != (xmlChar **)0x0) {
      for (; *ppxVar6 != (xmlChar *)0x0; ppxVar6 = ppxVar6 + 1) {
        (*_xmlFree)();
      }
      (*_xmlFree)(ppxVar8);
    }
    libxml_PyFileRelease(f);
    iVar3 = xmlOutputBufferClose(uVar4);
    if (-1 < iVar2) {
      pPVar5 = (PyObject *)PyLong_FromLong((long)iVar3);
      return pPVar5;
    }
    pcVar7 = "libxml2 xmlC14NDocSaveTo failure.";
    uVar4 = _PyExc_Exception;
  }
  PyErr_SetString(uVar4,pcVar7);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *
libxml_C14NDocSaveTo(ATTRIBUTE_UNUSED PyObject * self,
                     PyObject * args)
{
    PyObject *pyobj_doc;
    PyObject *py_file;
    PyObject *pyobj_nodes;
    int exclusive;
    PyObject *pyobj_prefixes;
    int with_comments;

    xmlDocPtr doc;
    xmlNodeSetPtr nodes;
    xmlChar **prefixes = NULL;
    FILE * output;
    xmlOutputBufferPtr buf;

    int result;
    int len;

    if (!PyArg_ParseTuple(args, (char *) "OOiOiO:C14NDocSaveTo",
                          &pyobj_doc,
                          &pyobj_nodes,
                          &exclusive,
                          &pyobj_prefixes,
                          &with_comments,
                          &py_file))
        return (NULL);

    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    if (!doc) {
        PyErr_SetString(PyExc_TypeError, "bad document.");
        return NULL;
    }

    output = PyFile_Get(py_file);
    if (output == NULL) {
        PyErr_SetString(PyExc_TypeError, "bad file.");
        return NULL;
    }
    buf = xmlOutputBufferCreateFile(output, NULL);

    result = PyxmlNodeSet_Convert(pyobj_nodes, &nodes);
    if (result < 0) {
        xmlOutputBufferClose(buf);
        return NULL;
    }

    if (exclusive) {
        result = PystringSet_Convert(pyobj_prefixes, &prefixes);
        if (result < 0) {
            if (nodes) {
                xmlFree(nodes->nodeTab);
                xmlFree(nodes);
            }
            xmlOutputBufferClose(buf);
            return NULL;
        }
    }

    result = xmlC14NDocSaveTo(doc,
                              nodes,
                              exclusive,
                              prefixes,
                              with_comments,
                              buf);

    if (nodes) {
        xmlFree(nodes->nodeTab);
        xmlFree(nodes);
    }
    if (prefixes) {
        xmlChar ** idx = prefixes;
        while (*idx) xmlFree(*(idx++));
        xmlFree(prefixes);
    }

    PyFile_Release(output);
    len = xmlOutputBufferClose(buf);

    if (result < 0) {
        PyErr_SetString(PyExc_Exception,
                        "libxml2 xmlC14NDocSaveTo failure.");
        return NULL;
    }
    else
        return PyLong_FromLong((long) len);
}